

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.hpp
# Opt level: O2

void __thiscall
boost::xpressive::detail::xpression_linker<char>::
accept<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,mpl_::bool_<true>>
          (xpression_linker<char> *this,
          optional_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<true>_>
          *matcher,void *next)

{
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar1;
  void *local_18;
  
  local_18 = next;
  std::deque<const_void_*,_std::allocator<const_void_*>_>::push_back
            ((deque<const_void_*,_std::allocator<const_void_*>_> *)this,&local_18);
  pmVar1 = (matcher->xpr_).xpr_.px;
  (*(pmVar1->
    super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._vptr_matchable[3])(pmVar1,this);
  return;
}

Assistant:

void accept(optional_matcher<Xpr, Greedy> const &matcher, void const *next)
    {
        this->back_stack_.push(next);
        matcher.xpr_.link(*this);
    }